

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# container_memory.h
# Opt level: O0

void * absl::lts_20250127::container_internal::
       Allocate<8ul,std::allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>>
                 (allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_>
                  *alloc,size_t n)

{
  pointer pAVar1;
  void *p;
  size_t sStack_18;
  A my_mem_alloc;
  size_t n_local;
  allocator<std::pair<const_int,_google::protobuf::internal::ExtensionSet::Extension>_> *alloc_local
  ;
  
  sStack_18 = n;
  if (n == 0) {
    __assert_fail("n && \"n must be positive\"",
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/container_memory.h"
                  ,0x3a,
                  "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>]"
                 );
  }
  std::allocator<absl::lts_20250127::container_internal::AlignedType<8ul>>::
  allocator<std::pair<int_const,google::protobuf::internal::ExtensionSet::Extension>>
            ((allocator<absl::lts_20250127::container_internal::AlignedType<8ul>> *)((long)&p + 7),
             alloc);
  pAVar1 = std::
           allocator_traits<std::allocator<absl::lts_20250127::container_internal::AlignedType<8UL>_>_>
           ::allocate((allocator_type *)((long)&p + 7),sStack_18 + 7 >> 3);
  if (((ulong)pAVar1 & 7) != 0) {
    __assert_fail("reinterpret_cast<uintptr_t>(p) % Alignment == 0 && \"allocator does not respect alignment\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O0/_deps/absl-src/absl/container/internal/container_memory.h"
                  ,0x44,
                  "void *absl::container_internal::Allocate(Alloc *, size_t) [Alignment = 8UL, Alloc = std::allocator<std::pair<const int, google::protobuf::internal::ExtensionSet::Extension>>]"
                 );
  }
  std::allocator<absl::lts_20250127::container_internal::AlignedType<8UL>_>::~allocator
            ((allocator<absl::lts_20250127::container_internal::AlignedType<8UL>_> *)((long)&p + 7))
  ;
  return pAVar1;
}

Assistant:

void* Allocate(Alloc* alloc, size_t n) {
  static_assert(Alignment > 0, "");
  assert(n && "n must be positive");
  using M = AlignedType<Alignment>;
  using A = typename absl::allocator_traits<Alloc>::template rebind_alloc<M>;
  using AT = typename absl::allocator_traits<Alloc>::template rebind_traits<M>;
  // On macOS, "mem_alloc" is a #define with one argument defined in
  // rpc/types.h, so we can't name the variable "mem_alloc" and initialize it
  // with the "foo(bar)" syntax.
  A my_mem_alloc(*alloc);
  void* p = AT::allocate(my_mem_alloc, (n + sizeof(M) - 1) / sizeof(M));
  assert(reinterpret_cast<uintptr_t>(p) % Alignment == 0 &&
         "allocator does not respect alignment");
  return p;
}